

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

size_t __thiscall libchars::editor::render(editor *this,size_t buf_idx,size_t length)

{
  edit_object *peVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type **__n;
  size_type *local_40;
  string sequence;
  
  sequence._M_dataplus._M_p = (pointer)0x0;
  sequence._M_string_length._0_1_ = 0;
  peVar1 = this->obj;
  if (peVar1->buflen < buf_idx) {
    buf_idx = peVar1->buflen;
  }
  __n = &local_40;
  local_40 = &sequence._M_string_length;
  iVar2 = (*peVar1->_vptr_edit_object[0xb])(peVar1,buf_idx);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    terminal_driver::write(this->driver,(int)local_40,sequence._M_dataplus._M_p,(size_t)__n);
  }
  if (local_40 != &sequence._M_string_length) {
    operator_delete(local_40,CONCAT71(sequence._M_string_length._1_7_,
                                      (undefined1)sequence._M_string_length) + 1);
  }
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

size_t editor::render(size_t buf_idx, size_t length)
    {
        std::string sequence;
        size_t n = obj->render(obj->idx(buf_idx),length,sequence);
        if (n > 0)
            driver.write(sequence.data(),sequence.length());
        return n;
    }